

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O1

bool __thiscall Initialize::CreateSubDirs(Initialize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  iterator __position;
  byte bVar4;
  char cVar5;
  vector<int,_std::allocator<int>_> *this_00;
  Tools *pTVar6;
  long *plVar7;
  Logger *pLVar8;
  undefined8 uVar9;
  size_type *psVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ifstream file;
  string_type local_2e8;
  uint local_2c4;
  path local_2c0;
  string local_298;
  long *local_278 [2];
  long local_268 [2];
  undefined1 local_258 [32];
  string local_238 [520];
  
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_238);
  lVar12 = 8;
  uVar13 = 0;
  while( true ) {
    pTVar6 = Tools::getInstance();
    if ((ulong)((long)(pTVar6->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar6->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13) break;
    local_278[0] = local_268;
    pcVar2 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,pcVar2,pcVar2 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)local_278);
    pTVar6 = Tools::getInstance();
    pbVar3 = (pTVar6->subDirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar6->subDirs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar13) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13)
      ;
      goto LAB_001053c9;
    }
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_278,*(ulong *)((long)pbVar3 + lVar12 + -8));
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2e8.field_2._M_allocated_capacity = *psVar10;
      local_2e8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar10;
      local_2e8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2e8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::filesystem::__cxx11::path::path(&local_2c0,&local_2e8,auto_format);
    bVar4 = std::filesystem::create_directory(&local_2c0);
    local_2c4 = (uint)bVar4;
    __position._M_current =
         (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (this_00,__position,(int *)&local_2c4);
    }
    else {
      *__position._M_current = local_2c4;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    std::filesystem::__cxx11::path::~path(&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_278[0] != local_268) {
      operator_delete(local_278[0],local_268[0] + 1);
    }
    uVar13 = uVar13 + 1;
    lVar12 = lVar12 + 0x20;
  }
  paVar1 = &local_2c0._M_pathname.field_2;
  bVar11 = true;
  lVar12 = 0;
  this_00 = (vector<int,_std::allocator<int>_> *)0x0;
  do {
    pTVar6 = Tools::getInstance();
    if ((vector<int,_std::allocator<int>_> *)
        ((long)(pTVar6->subDirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(pTVar6->subDirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5) <= this_00) {
      if (bVar11) {
        pLVar8 = Logger::getInstance();
        local_258._0_8_ = (vector<int,_std::allocator<int>_> *)(local_258 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_258,"Directories created successfully","");
        Logger::LogInformation(pLVar8,(string *)local_258);
        if ((vector<int,_std::allocator<int>_> *)local_258._0_8_ !=
            (vector<int,_std::allocator<int>_> *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
      }
      std::ifstream::~ifstream(local_238);
      return bVar11;
    }
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    pcVar2 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,pcVar2,pcVar2 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)&local_2e8);
    pTVar6 = Tools::getInstance();
    pbVar3 = (pTVar6->subDirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((vector<int,_std::allocator<int>_> *)
        ((long)(pTVar6->subDirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= this_00) break;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2e8,
                                *(ulong *)((long)&(pbVar3->_M_dataplus)._M_p + lVar12));
    psVar10 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_2c0._M_pathname.field_2._M_allocated_capacity = *psVar10;
      local_2c0._M_pathname.field_2._8_8_ = plVar7[3];
      local_2c0._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2c0._M_pathname.field_2._M_allocated_capacity = *psVar10;
      local_2c0._M_pathname._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2c0._M_pathname._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::ifstream::open(local_238,(_Ios_Openmode)&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c0._M_pathname._M_dataplus._M_p,
                      local_2c0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      pLVar8 = Logger::getInstance();
      pTVar6 = Tools::getInstance();
      pbVar3 = (pTVar6->subDirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((vector<int,_std::allocator<int>_> *)
          ((long)(pTVar6->subDirs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= this_00)
      goto LAB_001053da;
      std::operator+(&local_2c0._M_pathname,"Directory ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar3->_M_dataplus)._M_p + lVar12));
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2c0);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_298.field_2._M_allocated_capacity = *psVar10;
        local_298.field_2._8_8_ = plVar7[3];
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar10;
        local_298._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_298._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      Logger::LogError(pLVar8,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c0._M_pathname._M_dataplus._M_p,
                        local_2c0._M_pathname.field_2._M_allocated_capacity + 1);
      }
      bVar11 = false;
    }
    this_00 = (vector<int,_std::allocator<int>_> *)
              ((long)&(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + 1);
    lVar12 = lVar12 + 0x20;
  } while( true );
LAB_001053c9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",this_00);
LAB_001053da:
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     this_00);
  if ((vector<int,_std::allocator<int>_> *)local_258._0_8_ != this_00) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar9);
}

Assistant:

bool CreateSubDirs() {
        vector<int> *dirs = new vector<int>{};
        ifstream file;
        bool isCreated = true;
        for (int i = 0; i < Tools::getInstance()->subDirs->size(); i++) {
            dirs->push_back(filesystem::create_directory(this->path + "/" + Tools::getInstance()->subDirs->at(i)));
        }

        for (int i = 0; i < Tools::getInstance()->subDirs->size(); i++) {
            file.open(this->path + "/" + Tools::getInstance()->subDirs->at(i));
            if (!file.is_open()) {
                Logger::getInstance()->LogError(
                        "Directory " + Tools::getInstance()->subDirs->at(i) + " didn't create");
                isCreated = false;
            }
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("Directories created successfully");
        }

        return isCreated;
    }